

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O2

matrix3 * matrix3_scalev2(matrix3 *self,vector2 *scale)

{
  matrix3 scalingMatrix;
  matrix3 local_34;
  
  matrix3_make_transformation_scalingv2(&local_34,scale);
  matrix3_multiply(self,&local_34);
  return self;
}

Assistant:

HYPAPI struct matrix3 *matrix3_scalev2(struct matrix3 *self, const struct vector2 *scale)
{
	struct matrix3 scalingMatrix;

	return matrix3_multiply(self,
		matrix3_make_transformation_scalingv2(&scalingMatrix, scale));
}